

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O3

state_status_t
tchecker::zg::initialize
          (system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,zone_sptr_t *zone,
          vedge_sptr_t *vedge,sync_id_t *sync_id,clock_constraint_container_t *invariant,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *attributes)

{
  clock_id_t dim;
  state_status_t sVar1;
  status_t sVar2;
  mapped_type *str;
  db_t *dbm;
  clock_constraint_container_t local_68;
  key_type local_50;
  
  sVar1 = ta::initialize(system,vloc,intval,vedge,sync_id,invariant,attributes);
  if (sVar1 != 1) {
    return sVar1;
  }
  local_68.
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"zone","");
  str = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at(attributes,&local_50);
  from_string(&local_68,(clock_variables_t *)system,str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (&zone->_t->super_zone_t != (zone_t *)0x0) {
    dbm = zone_t::dbm(&zone->_t->super_zone_t);
    if (zone->_t != (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0) {
      dim = (zone->_t->super_zone_t)._dim;
      tchecker::dbm::universal_positive(dbm,dim);
      sVar2 = tchecker::dbm::constrain(dbm,dim,&local_68);
      if (sVar2 == EMPTY) {
        sVar1 = 0x4000;
      }
      else {
        sVar2 = tchecker::dbm::constrain(dbm,dim,invariant);
        sVar1 = 1;
        if (sVar2 == EMPTY) {
          sVar1 = 0x80;
        }
      }
      if (local_68.
          super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return sVar1;
      }
      operator_delete(local_68.
                      super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return sVar1;
    }
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::zg::zone_t>]"
               );
}

Assistant:

tchecker::state_status_t initialize(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                                    tchecker::intval_sptr_t const & intval, tchecker::zg::zone_sptr_t const & zone,
                                    tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                                    tchecker::clock_constraint_container_t & invariant,
                                    std::map<std::string, std::string> const & attributes)
{
  // initialize vloc, intval and vedge from ta
  auto state_status = tchecker::ta::initialize(system, vloc, intval, vedge, sync_id, invariant, attributes);
  if (state_status != STATE_OK)
    return state_status;

  // initialize zone from attributes["zone"]
  tchecker::clock_constraint_container_t clk_constraints;
  try {
    tchecker::from_string(clk_constraints, system.clock_variables(), attributes.at("zone"));
  }
  catch (...) {
    return tchecker::STATE_BAD;
  }

  tchecker::dbm::db_t * dbm = zone->dbm();
  tchecker::clock_id_t const dim = zone->dim();
  tchecker::dbm::universal_positive(dbm, dim);
  tchecker::dbm::status_t zone_status = tchecker::dbm::constrain(dbm, dim, clk_constraints);
  if (zone_status == tchecker::dbm::EMPTY)
    return tchecker::STATE_BAD;

  // Apply invariant
  zone_status = tchecker::dbm::constrain(dbm, dim, invariant);
  if (zone_status == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;

  return tchecker::STATE_OK;
}